

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_construct_destruct_valid_fn(int _i)

{
  int line;
  AString *str;
  char *pcVar1;
  char *pcVar2;
  char *expr;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  str = AString_construct();
  if (str == (AString *)0x0) {
    pcVar2 = (char *)0x0;
    pcVar5 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x";
    pcVar3 = "(void*) string != NULL";
    pcVar4 = "(void*) string";
    line = 0x53;
    goto LAB_0011e3e3;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x53);
  if (str->reallocator == (ACUtilsReallocator)0x0) {
    pcVar2 = (char *)0x0;
    pcVar5 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x";
    pcVar3 = "(void*) string->reallocator != NULL";
    pcVar4 = "(void*) string->reallocator";
    line = 0x54;
    goto LAB_0011e3e3;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x54);
  if (str->deallocator == (ACUtilsDeallocator)0x0) {
    pcVar2 = (char *)0x0;
    pcVar5 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x";
    pcVar3 = "(void*) string->deallocator != NULL";
    pcVar4 = "(void*) string->deallocator";
    line = 0x55;
    goto LAB_0011e3e3;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x55);
  pcVar2 = (char *)str->capacity;
  if (pcVar2 == (char *)0x8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x56);
    if (str->buffer == (char *)0x0) {
      pcVar2 = (char *)0x0;
      pcVar5 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar1 = "Assertion \'%s\' failed: %s == %#x";
      pcVar3 = "(void*) (*string).buffer != NULL";
      pcVar4 = "(void*) (*string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x56);
      pcVar5 = str->buffer;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "(null)";
        pcVar2 = "";
      }
      else {
        if (*pcVar5 == '\0') {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x56);
          pcVar2 = (char *)str->size;
          if (pcVar2 == (char *)0x0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x56);
            AString_destruct(str);
            return;
          }
          pcVar5 = "strlen(\"\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar3 = "(*string).size == strlen(\"\")";
          pcVar4 = "(*string).size";
          goto LAB_0011e3e1;
        }
        pcVar2 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar1 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar3 = "(*string).buffer == (\"\")";
      pcVar4 = "(*string).buffer";
    }
  }
  else {
    pcVar5 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar3 = "(*string).capacity == (8)";
    pcVar4 = "(*string).capacity";
  }
LAB_0011e3e1:
  line = 0x56;
LAB_0011e3e3:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,expr,pcVar1,pcVar3,pcVar4,pcVar2,pcVar5);
}

Assistant:

START_TEST(test_AString_construct_destruct_valid)
{
    struct AString *string = AString_construct();
    ACUTILSTEST_ASSERT_PTR_NONNULL(string);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->reallocator);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->deallocator);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*string, "", 8);
    AString_destruct(string);
}